

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::Info,_char> *di)

{
  element_type *peVar1;
  JObject *this;
  list<pstack::Dwarf::PubnameUnit,_std::allocator<pstack::Dwarf::PubnameUnit>_> *v;
  CFI *pCVar2;
  char local_40;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  element_type *local_30;
  JObject writer;
  
  writer.os = (ostream *)0x168abe;
  local_30 = (element_type *)os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  Dwarf::Info::getUnits((Info *)&stack0xffffffffffffffc0);
  writer.sep._6_1_ = 0;
  this = JObject::field<char[6],pstack::Dwarf::Units,char>
                   ((JObject *)&stack0xffffffffffffffd0,(char (*) [6])"units",
                    (Units *)&stack0xffffffffffffffc0,(char *)((long)&writer.sep + 6));
  v = Dwarf::Info::pubnames_abi_cxx11_(di->object);
  writer.sep._7_1_ = 0;
  JObject::
  field<char[13],std::__cxx11::list<pstack::Dwarf::PubnameUnit,std::allocator<pstack::Dwarf::PubnameUnit>>,char>
            (this,(char (*) [13])"pubnameUnits",v,(char *)((long)&writer.sep + 7));
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  pCVar2 = Dwarf::Info::getCFI(di->object,FI_DEBUG_FRAME);
  if (pCVar2 != (CFI *)0x0) {
    local_40 = '\0';
    JObject::field<char[11],pstack::Dwarf::CFI,char>
              ((JObject *)&stack0xffffffffffffffd0,(char (*) [11])"debugframe",pCVar2,
               &stack0xffffffffffffffc0);
  }
  pCVar2 = Dwarf::Info::getCFI(di->object,FI_EH_FRAME);
  local_40 = '\0';
  JObject::field<char[8],pstack::Dwarf::CFI,char>
            ((JObject *)&stack0xffffffffffffffd0,(char (*) [8])"ehFrame",pCVar2,
             &stack0xffffffffffffffc0);
  peVar1 = local_30;
  JObject::~JObject((JObject *)&stack0xffffffffffffffd0);
  return (ostream *)peVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Dwarf::Info> &di)
{
    JObject writer(os);
    writer.field("units", di.object.getUnits())
        .field("pubnameUnits", di.object.pubnames())
        ; // XXX .field("aranges", di->getARanges());

    auto debugFrame = di.object.getCFI( Dwarf::FI_DEBUG_FRAME );
    if (debugFrame)
        writer.field("debugframe", *debugFrame);
    auto ehFrame = di.object.getCFI( Dwarf::FI_EH_FRAME );
        writer.field("ehFrame", *ehFrame);
    return writer;
}